

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O1

Availability __thiscall
anon_unknown.dwarf_dbfaef::Satisfier::SatHash
          (Satisfier *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *hash,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *preimage,ChallengeType chtype)

{
  long lVar1;
  size_type sVar2;
  const_iterator cVar3;
  Availability AVar4;
  long lVar5;
  long in_FS_OFFSET;
  key_type local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.second =
       *(uint *)(hash->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_38.first = chtype;
  sVar2 = std::
          set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
          ::count(&this->supported,&local_38);
  lVar1 = (anonymous_namespace)::g_testdata;
  AVar4 = NO;
  if (sVar2 != 0) {
    lVar5 = 0x1f8;
    if (chtype < HASH160) {
      lVar5 = (ulong)chtype * 0x30 + 0x168;
    }
    cVar3 = std::
            _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find((_Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)((anonymous_namespace)::g_testdata + lVar5),hash);
    AVar4 = NO;
    if (cVar3._M_node != (_Base_ptr)(lVar1 + lVar5 + 8)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (preimage,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &cVar3._M_node[1]._M_right);
      AVar4 = YES;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return AVar4;
  }
  __stack_chk_fail();
}

Assistant:

miniscript::Availability SatHash(const std::vector<unsigned char>& hash, std::vector<unsigned char>& preimage, ChallengeType chtype) const {
        if (!supported.count(Challenge(chtype, ChallengeNumber(hash)))) return miniscript::Availability::NO;
        const auto& m =
            chtype == ChallengeType::SHA256 ? g_testdata->sha256_preimages :
            chtype == ChallengeType::HASH256 ? g_testdata->hash256_preimages :
            chtype == ChallengeType::RIPEMD160 ? g_testdata->ripemd160_preimages :
            g_testdata->hash160_preimages;
        auto it = m.find(hash);
        if (it == m.end()) return miniscript::Availability::NO;
        preimage = it->second;
        return miniscript::Availability::YES;
    }